

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_entt_entity_editor.hpp
# Opt level: O2

ComponentInfo * __thiscall
MM::EntityEditor<entt::entity>::registerComponent<Components::Velocity>
          (EntityEditor<entt::entity> *this,string *name)

{
  ComponentInfo *pCVar1;
  code *local_28 [2];
  code *local_18;
  code *local_10;
  
  local_28[1] = (code *)0x0;
  local_28[0] = ComponentEditorWidget<Components::Velocity,entt::entity>;
  local_10 = std::
             _Function_handler<void_(entt::basic_registry<entt::entity>_&,_entt::entity),_void_(*)(entt::basic_registry<entt::entity>_&,_entt::entity)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(entt::basic_registry<entt::entity>_&,_entt::entity),_void_(*)(entt::basic_registry<entt::entity>_&,_entt::entity)>
             ::_M_manager;
  pCVar1 = registerComponent<Components::Velocity>(this,name,(Callback *)local_28);
  std::_Function_base::~_Function_base((_Function_base *)local_28);
  return pCVar1;
}

Assistant:

ComponentInfo& registerComponent(const std::string& name)
	{
		return registerComponent<Component>(name, ComponentEditorWidget<Component, EntityType>);
	}